

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFFAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::UFFAtomTypesSectionParser::parseLine
          (UFFAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  double dVar1;
  double dVar2;
  ForceFieldOptions *pFVar3;
  int iVar4;
  AtomType *pAVar5;
  RealType Radius;
  UFFAdapter uffa;
  string atomTypeName;
  StringTokenizer tokenizer;
  UFFAdapter local_f0;
  string local_e8;
  RealType local_c8;
  RealType local_c0;
  RealType local_b8;
  RealType local_b0;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  RealType local_90;
  RealType local_88;
  RealType local_80;
  StringTokenizer local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8," ;\t\n\r",(allocator<char> *)&local_f0);
  StringTokenizer::StringTokenizer(&local_78,line,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  iVar4 = StringTokenizer::countTokens(&local_78);
  if (iVar4 < 0xc) {
    snprintf(painCave.errMsg,2000,"UFFAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_e8,&local_78);
    pAVar5 = ForceField::getAtomType(ff,&local_e8);
    if (pAVar5 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "UFFAtomTypesSectionParser Error: Atom Type [%s] has not been created yet\n",
               local_e8._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_f0.at_ = pAVar5;
      local_80 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_88 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_90 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_98 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_a0 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_b8 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_c0 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_c8 = StringTokenizer::nextTokenAsDouble(&local_78);
      Radius = StringTokenizer::nextTokenAsDouble(&local_78);
      pFVar3 = this->options_;
      dVar1 = (pFVar3->EnergyUnitScaling).data_;
      dVar2 = (pFVar3->DistanceUnitScaling).data_;
      UFFAdapter::makeUFF(&local_f0,local_80 * dVar2,local_88 * (pFVar3->AngleUnitScaling).data_,
                          local_90 * dVar2,local_98 * dVar1,local_a0,
                          local_a8 * (pFVar3->ChargeUnitScaling).data_,local_b0 * dVar1,
                          local_b8 * dVar1,local_c0,local_c8,Radius);
    }
    std::__cxx11::string::~string((string *)&local_e8);
  }
  StringTokenizer::~StringTokenizer(&local_78);
  return;
}

Assistant:

void UFFAtomTypesSectionParser::parseLine(ForceField& ff,
                                            const std::string& line,
                                            int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in UFFAtomTypesSectionParser, a line at least contains 12 tokens:
    // Atom r1 theta0 x1 D1 zeta Z1 Vi Uj Xi Hard Radius

    if (nTokens < 12) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UFFAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        UFFAdapter uffa = UFFAdapter(atomType);

        RealType r1     = tokenizer.nextTokenAsDouble();
        RealType theta0 = tokenizer.nextTokenAsDouble();
        RealType x1     = tokenizer.nextTokenAsDouble();
        RealType D1     = tokenizer.nextTokenAsDouble();
        RealType zeta   = tokenizer.nextTokenAsDouble();
        RealType Z1     = tokenizer.nextTokenAsDouble();
        RealType Vi     = tokenizer.nextTokenAsDouble();
        RealType Uj     = tokenizer.nextTokenAsDouble();
        RealType Xi     = tokenizer.nextTokenAsDouble();
        RealType Hard   = tokenizer.nextTokenAsDouble();
        RealType Radius = tokenizer.nextTokenAsDouble();

        r1 *= options_.getDistanceUnitScaling();
        theta0 *= options_.getAngleUnitScaling();
        x1 *= options_.getDistanceUnitScaling();
        D1 *= options_.getEnergyUnitScaling();
        Z1 *= options_.getChargeUnitScaling();
        Vi *= options_.getEnergyUnitScaling();
        Uj *= options_.getEnergyUnitScaling();

        uffa.makeUFF(r1, theta0, x1, D1, zeta, Z1, Vi, Uj, Xi, Hard, Radius);

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UFFAtomTypesSectionParser Error: Atom Type [%s]"
                 " has not been created yet\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }